

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O0

int Abc_AigCheckTfi_rec(Abc_Obj_t *pNode,Abc_Obj_t *pOld)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pOld_local;
  Abc_Obj_t *pNode_local;
  
  if (pNode == (Abc_Obj_t *)0x0) {
    pNode_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_ObjIsCi(pNode);
    if (iVar1 == 0) {
      if (pNode == pOld) {
        pNode_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_NodeIsTravIdCurrent(pNode);
        if (iVar1 == 0) {
          Abc_NodeSetTravIdCurrent(pNode);
          pAVar2 = Abc_ObjFanin0(pNode);
          iVar1 = Abc_AigCheckTfi_rec(pAVar2,pOld);
          if (iVar1 == 0) {
            pAVar2 = Abc_ObjFanin1(pNode);
            iVar1 = Abc_AigCheckTfi_rec(pAVar2,pOld);
            if (iVar1 == 0) {
              pNode_local._4_4_ = Abc_AigCheckTfi_rec((Abc_Obj_t *)(pNode->field_5).pData,pOld);
            }
            else {
              pNode_local._4_4_ = 1;
            }
          }
          else {
            pNode_local._4_4_ = 1;
          }
        }
        else {
          pNode_local._4_4_ = 0;
        }
      }
    }
    else {
      pNode_local._4_4_ = 0;
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_AigCheckTfi_rec( Abc_Obj_t * pNode, Abc_Obj_t * pOld )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return 0;
    Abc_NodeSetTravIdCurrent( pNode );
    // check the children
    if ( Abc_AigCheckTfi_rec( Abc_ObjFanin0(pNode), pOld ) )
        return 1;
    if ( Abc_AigCheckTfi_rec( Abc_ObjFanin1(pNode), pOld ) )
        return 1;
    // check equivalent nodes
    return Abc_AigCheckTfi_rec( (Abc_Obj_t *)pNode->pData, pOld );
}